

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7d1152::AVxFirstPassEncoderThreadTest::~AVxFirstPassEncoderThreadTest
          (AVxFirstPassEncoderThreadTest *this)

{
  pointer pcVar1;
  
  (this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__AVxFirstPassEncoderThreadTest_0104b6f0;
  (this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AVxFirstPassEncoderThreadTest_0104b758;
  (this->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__AVxFirstPassEncoderThreadTest_0104b778;
  free((this->firstpass_stats_).buf);
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__EncoderTest_01081d70;
  pcVar1 = (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_EncoderTest).stats_.buffer_.field_2) {
    operator_delete(pcVar1);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~AVxFirstPassEncoderThreadTest() override { free(firstpass_stats_.buf); }